

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sophia_interface.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
sophia_interface::LUKFDI
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,sophia_interface *this,int KFL1
          ,int KFL2)

{
  bool bVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  sophia_interface *psVar6;
  ulong uVar7;
  long lVar8;
  int *piVar9;
  int iVar10;
  int iVar11;
  byte bVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  sophia_interface *psVar16;
  vector<int,std::allocator<int>> *pvVar17;
  iterator iVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  sophia_interface *psVar25;
  int iVar26;
  bool bVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  double dVar30;
  double dVar31;
  undefined1 local_148 [32];
  undefined1 local_128 [32];
  double local_108;
  ulong local_100;
  double local_f8;
  double local_f0;
  uint local_e8;
  uint local_e4;
  double local_e0;
  sophia_interface *local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  ulong local_b0;
  double local_a8;
  undefined8 local_a0;
  ulong local_98;
  double local_90;
  double local_88;
  double local_80;
  vector<int,std::allocator<int>> *local_78;
  double local_70;
  sophia_interface *local_68;
  uint local_60;
  uint local_5c;
  double local_58;
  int local_50;
  uint local_4c;
  double local_48;
  uint local_3c;
  uint local_38;
  int local_34 [2];
  int KF;
  
  local_38 = 0;
  local_34[0] = 0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98 = (ulong)(uint)-KFL1;
  if (0 < KFL1) {
    local_98 = (ulong)(uint)KFL1;
  }
  uVar5 = (uint)local_98;
  psVar25 = (sophia_interface *)(ulong)(uint)-KFL2;
  if (0 < KFL2) {
    psVar25 = (sophia_interface *)(ulong)(uint)KFL2;
  }
  local_3c = KFL1;
  if (KFL1 == 0) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)__return_storage_ptr__,(iterator)0x0,
               (int *)&local_38);
  }
  else {
    uVar19 = (uint)psVar25;
    if (KFL2 == 0) {
LAB_00127581:
      psVar6 = (sophia_interface *)__return_storage_ptr__;
      local_78 = (vector<int,std::allocator<int>> *)__return_storage_ptr__;
      local_68 = psVar25;
      local_50 = KFL2;
      local_4c = uVar5;
      if (MSTJ[0xe] != 1) goto LAB_00127bf1;
      uVar23 = 0xffffffff;
      if (uVar5 < 7) {
        uVar23 = uVar5;
      }
      uVar15 = (int)(local_98 / 1000) + (int)(local_98 / 10000) * -10;
      uVar22 = (int)(local_98 / 100) + (int)(local_98 / 1000) * -10;
      if ((uVar22 - 1 | uVar15 - 1) < 4) {
        bVar12 = ((char)local_98 + (char)(local_98 / 10) * -10) - 1;
        uVar23 = ((uint)(bVar12 >> 7) + (int)(char)bVar12 >> 1 & 0xff) +
                 (uVar15 - 2) * uVar15 + uVar22 * 2 + 6;
      }
      uVar23 = uVar23 - (uVar15 == uVar22 && uVar15 - 1 < 4);
      if (uVar5 < 7) {
        uVar15 = uVar5;
      }
      if (KFL2 == 0) {
        uVar19 = 0;
      }
      else {
        psVar6 = (sophia_interface *)0xffffffff;
        if (uVar19 < 7) {
          psVar6 = psVar25;
        }
        iVar4 = (int)psVar6;
        iVar10 = (int)((ulong)psVar25 / 1000) + (int)((ulong)psVar25 / 10000) * -10;
        iVar13 = (int)((ulong)psVar25 / 100) + (int)((ulong)psVar25 / 1000) * -10;
        psVar6 = psVar25;
        if (iVar13 - 1U < 4 && iVar10 - 1U < 4) {
          bVar12 = ((char)psVar25 + (char)((ulong)psVar25 / 10) * -10) - 1;
          uVar19 = (uint)(bVar12 >> 7) + (int)(char)bVar12 >> 1 & 0xff;
          psVar6 = (sophia_interface *)(ulong)uVar19;
          iVar4 = (iVar10 + -2) * iVar10 + iVar13 * 2 + uVar19 + 6;
        }
        uVar19 = iVar4 - (uint)(iVar10 == iVar13 && iVar10 - 1U < 4);
      }
      if (((int)uVar23 < 0) || ((int)uVar19 < 0)) goto LAB_00127bf1;
      uVar24 = 1;
      uVar14 = 6;
      if ((uVar19 != 0 || 0 < MSTJ[0xb]) && ((uVar23 < 7 || uVar19 != 0) || 1 < MSTJ[0xb])) {
        uVar24 = uVar19 + (uVar19 == 0);
        uVar14 = 0x16;
        if (uVar19 != 0) {
          uVar14 = uVar19;
        }
      }
      local_48 = (double)(ulong)(uVar23 * 0x50);
      uVar5 = uVar23 * 0x50 + uVar24 + 0x77;
      local_88 = 0.0;
      iVar4 = 0;
      do {
        psVar25 = (sophia_interface *)(ulong)uVar5;
        iVar10 = (uVar14 - uVar24) + 1;
        if (uVar24 <= uVar14) {
          do {
            local_88 = local_88 + PARF[(int)psVar25];
            psVar25 = (sophia_interface *)(ulong)((int)psVar25 + 1);
            iVar10 = iVar10 + -1;
          } while (iVar10 != 0);
        }
        iVar4 = iVar4 + 1;
        uVar5 = uVar5 + 0x19;
      } while (iVar4 != 3);
      local_b0 = (ulong)uVar22;
      local_70 = (double)(ulong)uVar23;
      dVar30 = RLU(psVar25,false);
      uVar5 = local_4c;
      KFL2 = local_50;
      psVar25 = local_68;
      __return_storage_ptr__ = (vector<int,_std::allocator<int>_> *)local_78;
      dVar30 = local_88 * dVar30;
      iVar10 = SUB84(local_48,0) + 0x77;
      uVar19 = 0;
      iVar4 = 0;
      do {
        iVar13 = iVar4;
        uVar23 = uVar24;
        if (uVar24 <= uVar14) {
          do {
            dVar30 = dVar30 - PARF[(int)(iVar10 + uVar23)];
            if (dVar30 <= 0.0) goto LAB_00127866;
            uVar23 = uVar23 + 1;
            uVar19 = uVar14;
          } while (uVar14 + 1 != uVar23);
        }
        uVar23 = uVar19;
        iVar10 = iVar10 + 0x19;
        uVar19 = uVar23;
        iVar4 = iVar13 + 1;
      } while (iVar13 + 1 != 3);
LAB_00127866:
      uVar19 = SUB84(local_70,0);
      if ((int)uVar23 < 7) {
        iVar4 = uVar19 * 2 + -0xd;
        uVar24 = 0;
        uVar7 = (ulong)uVar23;
        uVar14 = uVar23;
      }
      else {
        uVar22 = 3;
        if (uVar23 < 0xb) {
          uVar22 = (uVar23 != 7) + 1;
        }
        uVar7 = 4;
        if (uVar23 < 0x10) {
          uVar7 = (ulong)uVar22;
        }
        uVar22 = (uint)uVar7;
        iVar10 = (uVar22 - 2) * uVar22;
        iVar4 = uVar23 - iVar10;
        uVar24 = (iVar4 - (iVar4 + -6 >> 0x1f)) + -6 >> 1;
        uVar14 = uVar24 * 100 + uVar22 * 1000;
        if ((uVar22 == uVar24) || (uVar23 != iVar10 + uVar24 * 2 + 6)) {
          uVar14 = uVar14 | 3;
        }
        else {
          uVar14 = uVar14 | 1;
        }
        iVar4 = uVar19 * -2 + 0xd;
      }
      uVar22 = (uint)uVar7;
      uVar20 = iVar4 * local_3c;
      psVar6 = (sophia_interface *)(ulong)uVar20;
      local_38 = -uVar14;
      if (-1 < (int)uVar20) {
        local_38 = uVar14;
      }
      uVar14 = (uint)local_b0;
      if (((uVar22 != uVar15) || (uVar24 != uVar14)) ||
         (psVar6 = (sophia_interface *)(ulong)CONCAT31((int3)(uVar20 >> 8),uVar14 == 0),
         3 < uVar15 && uVar14 == 0)) {
        if (((int)uVar19 < 7) && ((int)uVar23 < 7)) {
          uVar15 = uVar19;
          if ((int)uVar23 < (int)uVar19) {
            uVar15 = uVar23;
            uVar23 = uVar19;
          }
          iVar10 = uVar23 * 100 + uVar15 * 10 + iVar13 * 2 + 1;
          iVar4 = -iVar10;
          if ((uVar23 == local_4c) == -1 < (int)local_3c) {
            iVar4 = iVar10;
          }
          local_48 = (double)iVar4;
          dVar30 = pow(-1.0,(double)(int)uVar23);
          psVar25 = local_68;
          __return_storage_ptr__ = (vector<int,_std::allocator<int>_> *)local_78;
          local_34[0] = (int)(dVar30 * local_48);
          goto LAB_00127b6c;
        }
        if (((int)uVar19 < 7) || ((int)uVar23 < 7)) {
          if (6 < (int)uVar19) {
            uVar24 = uVar14;
          }
          uVar19 = uVar15;
          if ((int)uVar15 < (int)uVar22) {
            uVar19 = uVar22;
          }
          if ((int)uVar19 < (int)uVar24) {
            uVar19 = uVar24;
          }
          uVar23 = uVar22;
          if ((int)uVar15 < (int)uVar22) {
            uVar23 = uVar15;
          }
          if ((int)uVar24 < (int)uVar23) {
            uVar23 = uVar24;
          }
          iVar4 = ((uVar22 + uVar15 + uVar24) - uVar19) - uVar23;
          if (iVar13 == 0) {
            iVar10 = uVar23 * 100 + uVar19 * 1000;
            local_34[0] = -2 - (iVar10 + iVar4 * 10);
            if (-1 < (int)local_3c) {
              local_34[0] = iVar10 + iVar4 * 10 + 2;
            }
          }
          else {
            iVar4 = uVar19 * 1000 + iVar13 * 2 + uVar23 * 10 + iVar4 * 100;
            local_34[0] = -iVar4;
            if (-1 < (int)local_3c) {
              local_34[0] = iVar4;
            }
          }
          goto LAB_00127b6c;
        }
        uVar19 = (int)~local_3c >> 0x1f | 1;
        uVar23 = (int)local_3c >> 0x1f | 1;
        if (uVar22 == uVar15) {
          uVar20 = uVar24;
          uVar15 = uVar14;
          if ((int)uVar24 < (int)uVar14) {
            uVar20 = uVar14;
            uVar15 = uVar24;
          }
          if ((int)uVar24 <= (int)uVar14) {
            uVar19 = uVar23;
          }
          uVar21 = (ulong)uVar15;
LAB_00127b2b:
          local_48 = (double)(int)((uVar20 * 100 + iVar13 * 2 + (int)uVar21 * 10 + 1) * uVar19);
          dVar30 = pow(-1.0,(double)(int)uVar20);
          local_34[0] = (int)(dVar30 * local_48);
          goto LAB_00127b6c;
        }
        uVar21 = local_b0;
        uVar20 = uVar22;
        if (uVar15 == uVar24) goto LAB_00127b2b;
        if (uVar14 == uVar22) {
          uVar21 = (ulong)uVar24;
          uVar20 = uVar15;
          uVar19 = uVar23;
          goto LAB_00127b2b;
        }
        if (uVar24 == uVar14) {
          uVar21 = (ulong)uVar15;
          if ((int)uVar22 < (int)uVar15) {
            uVar20 = uVar15;
            uVar21 = uVar7;
          }
          if ((int)uVar22 <= (int)uVar15) {
            uVar19 = uVar23;
          }
          goto LAB_00127b2b;
        }
        psVar16 = (sophia_interface *)(local_148 + 0x10);
        psVar6 = (sophia_interface *)local_148;
        local_148._0_8_ = psVar16;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)psVar6,"LUKFDI: no matching flavours for qq -> qq","");
        LUERRM(psVar6,2,(string *)local_148);
        psVar6 = (sophia_interface *)local_148._0_8_;
      }
      else {
        dVar30 = RLU(psVar6,false);
        iVar10 = iVar13 * 0x19;
        iVar4 = SUB84(local_48,0);
        dVar31 = PARF[iVar4 + 0x8f + iVar10] + PARF[iVar4 + 0x8e + iVar10];
        dVar30 = (PARF[iVar4 + 0x90 + iVar10] + dVar31) * dVar30;
        __return_storage_ptr__ = (vector<int,_std::allocator<int>_> *)local_78;
        psVar25 = local_68;
        uVar5 = local_4c;
        if ((PARF[iVar4 + 0x8e + iVar10] < dVar30) ||
           (local_34[0] = iVar13 * 2 + 0x6f, dVar31 < dVar30)) {
          local_34[0] = iVar13 * 2 + 0x14b;
          if (dVar30 <= dVar31) {
            local_34[0] = iVar13 * 2 + 0xdd;
          }
        }
LAB_00127b6c:
        if (KFL2 != 0) {
          local_38 = 0;
        }
        iVar4 = LUCOMP(psVar6,local_34[0]);
        if (iVar4 != 0) {
          pvVar17 = (vector<int,std::allocator<int>> *)((long)__return_storage_ptr__ + 8);
          iVar18._M_current = *(int **)((long)__return_storage_ptr__ + 8);
          piVar9 = *(int **)((long)__return_storage_ptr__ + 0x10);
          if (iVar18._M_current == piVar9) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)__return_storage_ptr__,iVar18,
                       (int *)&local_38);
            iVar18._M_current = *(int **)((long)__return_storage_ptr__ + 8);
            piVar9 = *(int **)((long)__return_storage_ptr__ + 0x10);
          }
          else {
            *iVar18._M_current = local_38;
            iVar18._M_current = iVar18._M_current + 1;
            *(int **)pvVar17 = iVar18._M_current;
          }
          if (iVar18._M_current == piVar9) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)__return_storage_ptr__,iVar18,local_34);
            return (vector<int,_std::allocator<int>_> *)
                   (vector<int,std::allocator<int>> *)__return_storage_ptr__;
          }
          goto LAB_00128955;
        }
        psVar16 = (sophia_interface *)(local_128 + 0x10);
        psVar6 = (sophia_interface *)local_128;
        local_128._0_8_ = psVar16;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)psVar6,"LUKFDI: user-defined flavour probabilities failed","");
        LUERRM(psVar6,2,(string *)local_128);
        psVar6 = (sophia_interface *)local_128._0_8_;
      }
      if (psVar6 != psVar16) {
        operator_delete(psVar6);
      }
LAB_00127bf1:
      local_a8 = PARJ[3] * 3.0;
      local_58 = PARJ[1];
      local_f8 = PARJ[2];
      if (MSTJ[0xb] < 2) {
        local_90 = 0.0;
        local_c8 = 0.0;
        local_d0 = 0.0;
        local_b8 = 0.0;
        local_80 = 0.0;
        local_e0 = 0.0;
        local_70 = 0.0;
      }
      else {
        if (PARJ[2] < 0.0) {
          local_70 = sqrt(PARJ[2]);
        }
        else {
          local_70 = SQRT(PARJ[2]);
        }
        if (PARJ[3] < 0.0) {
          dVar30 = sqrt(PARJ[3]);
        }
        else {
          dVar30 = SQRT(PARJ[3]);
        }
        local_e0 = 1.0 / (dVar30 * 3.0);
        dVar30 = local_e0 + 1.0;
        local_b8 = ((local_58 * local_70 * PARJ[6] + 1.0) * dVar30 + 2.0) * PARJ[4];
        local_d0 = (PARJ[5] * dVar30 + local_58 * local_70 * PARJ[5] * PARJ[6]) * PARJ[4] +
                   (PARJ[6] * local_b8) / (local_70 + local_70);
        local_c8 = (local_58 * PARJ[6] + dVar30 / local_70) *
                   (PARJ[4] + PARJ[4]) * PARJ[5] * PARJ[6];
        dVar30 = local_d0;
        if (local_d0 <= local_b8) {
          dVar30 = local_b8;
        }
        local_90 = local_c8;
        if (local_c8 <= dVar30) {
          local_90 = dVar30;
        }
        local_80 = PARJ[6] / (PARJ[5] * local_70 + PARJ[6]);
        local_a8 = (local_a8 * (local_90 + 1.0)) / (local_90 / (local_e0 * 3.0) + 1.0);
      }
      local_e4 = 0;
      if (uVar5 < 0x2711) {
        local_e4 = uVar5;
      }
      local_e8 = 0;
      if ((uint)psVar25 - 0xb < 0x2706) {
        local_e8 = (uint)psVar25;
      }
      local_c0 = local_e0 * 3.0;
      local_5c = (int)~local_3c >> 0x1f | 1;
      local_a0 = (double)(CONCAT44(local_a0._4_4_,(int)local_3c >> 0x1f) | 1);
      uVar19 = (uint)(local_98 * 0x10624dd3 >> 0x26) +
               (int)((local_98 * 0x10624dd3) / 0x28000000000) * -10;
      local_b0 = (ulong)uVar19;
      uVar5 = (uint)(local_98 * 0x51eb851f >> 0x25) +
              (int)((local_98 * 0x51eb851f) / 0x14000000000) * -10;
      local_100 = (ulong)uVar5;
      local_88 = (double)CONCAT44(local_88._4_4_,uVar5 - uVar19);
      local_70 = local_70 * local_58;
      local_e0 = local_e0 + 1.0;
      dVar30 = local_e0;
      if (local_e0 <= 2.0) {
        dVar30 = 2.0;
      }
      local_108 = 1.0 / local_e0;
      local_e0 = local_e0 / dVar30;
      local_d8 = (sophia_interface *)(2.0 / dVar30);
      local_f0 = local_58 + 2.0;
LAB_00127f0b:
      do {
        if (local_4c < 0xb) {
          iVar4 = 0;
          if (0 < MSTJ[0xb] && KFL2 == 0) {
            local_48 = PARJ[0] + 1.0;
            iVar4 = 0;
            dVar30 = RLU(psVar6,false);
            if (1.0 < dVar30 * local_48) {
              iVar4 = 1;
            }
          }
          uVar23 = local_e8;
          if (10 < (uint)local_68) {
            iVar4 = 2;
          }
        }
        else {
          iVar4 = 2;
          uVar23 = local_e4;
        }
        if ((uVar23 != 0) && (1 < MSTJ[0xb])) {
          uVar22 = uVar23 / 1000 + (uVar23 / 10000) * -10;
          uVar14 = uVar23 / 100 + (uVar23 / 1000) * -10;
          uVar15 = uVar14;
          if (uVar14 < uVar22) {
            uVar15 = uVar22;
          }
          uVar28 = SUB84(local_d0,0);
          uVar29 = (undefined4)((ulong)local_d0 >> 0x20);
          if (uVar15 != 3) {
            uVar28 = SUB84(local_b8,0);
            uVar29 = (undefined4)((ulong)local_b8 >> 0x20);
          }
          if (uVar14 < uVar22) {
            uVar22 = uVar14;
          }
          local_48 = local_c8;
          if (uVar22 != 3) {
            local_48 = (double)CONCAT44(uVar29,uVar28);
          }
          uVar23 = uVar23 * -0x33333333 + 0x33333333;
          if ((uVar23 >> 1 | (uint)((uVar23 & 1) != 0) << 0x1f) < 0x1999999a) {
            local_48 = local_48 / local_c0;
          }
          dVar30 = RLU(psVar6,false);
          __return_storage_ptr__ = (vector<int,_std::allocator<int>_> *)local_78;
          dVar30 = (local_48 + 1.0) * dVar30;
          if (1.0 < dVar30) {
            iVar4 = -1;
          }
          if ((KFL2 != 0) && (1.0 < dVar30)) {
            pvVar17 = local_78 + 8;
            iVar18._M_current = *(int **)(local_78 + 8);
            piVar9 = *(int **)(local_78 + 0x10);
            if (iVar18._M_current == piVar9) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (local_78,iVar18,(int *)&local_38);
              iVar18._M_current = *(int **)((long)__return_storage_ptr__ + 8);
              piVar9 = *(int **)((long)__return_storage_ptr__ + 0x10);
            }
            else {
              *iVar18._M_current = local_38;
              iVar18._M_current = iVar18._M_current + 1;
              *(int **)pvVar17 = iVar18._M_current;
            }
            if (iVar18._M_current == piVar9) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)__return_storage_ptr__,iVar18,local_34);
              return (vector<int,_std::allocator<int>_> *)
                     (vector<int,std::allocator<int>> *)__return_storage_ptr__;
            }
            goto LAB_00128955;
          }
        }
        if (0 < iVar4) {
          local_70 = (double)CONCAT44(local_70._4_4_,iVar4);
          local_88 = (double)CONCAT71(local_88._1_7_,KFL2 == 0 && local_4c < 0xb);
          local_5c = local_4c + (uint)(local_98 * 0xcccccccd >> 0x23) * -10;
          uVar7 = (ulong)local_68 & 0xffffffff;
          local_e0 = (double)(ulong)(uint)((int)(uVar7 / 1000) + (int)(uVar7 / 10000) * -10);
          psVar25 = (sophia_interface *)
                    (ulong)(uint)((int)(uVar7 / 100) + (int)(uVar7 / 1000) * -10);
          local_60 = (int)local_68 + (int)(uVar7 / 10) * -10;
          local_58 = local_58 * local_f8 + 2.0;
          local_a0 = local_90 / local_c0 + 1.0;
          local_90 = local_90 + 1.0;
          local_d8 = psVar25;
          goto LAB_00128586;
        }
        if (iVar4 == 0) {
          if (local_50 == 0) {
            dVar30 = RLU(psVar6,false);
            local_38 = ~(int)(dVar30 * local_f0);
            if ((int)local_3c < 1) {
              local_38 = (int)(dVar30 * local_f0) + 1;
            }
          }
          uVar23 = -local_38;
          if (0 < (int)local_38) {
            uVar23 = local_38;
          }
          uVar23 = uVar23 + (uint)local_68;
          uVar22 = uVar23;
          uVar15 = local_4c;
          if (uVar23 < local_4c) {
            uVar22 = local_4c;
            uVar15 = uVar23;
          }
          local_60 = (uint)local_a0;
          if (local_4c < uVar23) {
            local_60 = local_5c;
          }
        }
        else {
          do {
            while( true ) {
              dVar30 = RLU(psVar6,false);
              uVar23 = (int)(dVar30 + 0.5) * local_88._0_4_ + (int)local_b0;
              uVar15 = (uVar19 + uVar5) - uVar23;
              if (((uVar23 != 3) ||
                  (dVar30 = RLU(psVar6,false), uVar22 = uVar23, uVar14 = uVar15, dVar30 <= local_80)
                  ) && ((uVar22 = uVar15, uVar14 = uVar23, uVar15 == 3 &&
                        (dVar30 = RLU(psVar6,false), uVar22 = uVar23, uVar14 = uVar15,
                        local_80 <= dVar30)))) {
                uVar22 = 3;
                uVar14 = uVar23;
              }
              local_48 = PARJ[6] * local_70;
              dVar30 = RLU(psVar6,false);
              iVar4 = (int)((local_48 + 2.0) * dVar30);
              uVar23 = iVar4 + 1;
              dVar30 = RLU(psVar6,false);
              if (uVar22 != uVar23) break;
              if (dVar30 <= (double)local_d8) {
                iVar10 = 3;
                uVar23 = uVar22;
                goto LAB_0012817f;
              }
            }
          } while (local_e0 < dVar30);
          dVar30 = RLU(psVar6,false);
          iVar10 = (int)(dVar30 + local_108) * 2 + 1;
LAB_0012817f:
          uVar15 = uVar23;
          if ((int)uVar23 < (int)uVar22) {
            uVar15 = uVar22;
          }
          if ((int)uVar23 < (int)uVar22) {
            uVar22 = uVar23;
          }
          iVar13 = uVar22 * 100 + uVar15 * 1000;
          local_38 = iVar10 + 10000 + iVar13;
          if (0 < (int)local_3c) {
            local_38 = (-10000 - iVar13) - iVar10;
          }
          uVar15 = uVar23;
          uVar22 = uVar14;
          if ((int)uVar14 <= (int)uVar23) {
            uVar15 = uVar14;
            uVar22 = uVar23;
          }
          local_60 = local_5c;
          if (iVar4 < (int)uVar14) {
            local_60 = (uint)local_a0;
          }
        }
        lVar8 = (ulong)(uVar22 != 3) * 8 + 0x58;
        if ((int)uVar22 < 3) {
          lVar8 = 0x50;
        }
        local_48 = *(double *)((long)PARJ + lVar8);
        dVar30 = RLU(psVar6,false);
        uVar23 = (uint)(dVar30 + local_48);
        if ((uVar23 != 0) || (PARJ[0xd] <= 0.0)) {
          if (uVar23 == 1) {
            if (PARJ[0xe] + PARJ[0xf] + PARJ[0x10] <= 0.0) {
              iVar4 = 3;
              uVar23 = 1;
            }
            else {
              dVar30 = RLU(psVar6,false);
              if (dVar30 < PARJ[0xe]) {
                iVar4 = 1;
                uVar23 = 3;
              }
              else {
                iVar4 = 3;
                uVar23 = 4;
                if (PARJ[0xe] + PARJ[0xf] <= dVar30) {
                  uVar23 = 5;
                  iVar4 = 5;
                  if (PARJ[0xe] + PARJ[0xf] + PARJ[0x10] <= dVar30) {
                    uVar23 = 1;
                    iVar4 = 3;
                  }
                }
              }
            }
          }
          else {
            iVar4 = (uVar23 != 3) + 1 + (uint)(uVar23 != 3);
            if (uVar23 == 0) {
              iVar4 = 1;
            }
            if (uVar23 == 5) {
              iVar4 = 5;
            }
          }
        }
        else {
          uVar23 = 0;
          dVar30 = RLU(psVar6,false);
          iVar4 = 1;
          if (dVar30 < PARJ[0xd]) {
            iVar4 = 3;
            uVar23 = 2;
          }
        }
        if (uVar22 == uVar15) {
          dVar30 = RLU(psVar6,false);
          if ((int)uVar15 < 4) {
            lVar8 = (long)(int)(uVar15 * 2 + uVar23 * 10);
            local_34[0] = ((int)(dVar30 + PMAS[3][lVar8 + 499]) +
                          (int)(PMAS[3][lVar8 + 0x1f2] + dVar30)) * 0x6e + iVar4 + 0x6e;
          }
          if (3 < (int)uVar22) {
            local_34[0] = iVar4 + uVar15 * 0x6e;
          }
        }
        else {
          local_48 = (double)(int)((uVar22 * 100 + uVar15 * 10 + iVar4) * local_60);
          dVar30 = pow(-1.0,(double)(int)uVar22);
          local_34[0] = (int)(dVar30 * local_48);
        }
        KFL2 = local_50;
        if ((uVar23 & 0xfffffffe) == 2) {
          iVar4 = local_34[0] + -10000;
          bVar27 = local_34[0] < 0;
          local_34[0] = local_34[0] + 10000;
          if (bVar27) {
            local_34[0] = iVar4;
          }
        }
        else if (uVar23 == 4) {
          iVar4 = local_34[0] + -20000;
          bVar27 = local_34[0] < 0;
          local_34[0] = local_34[0] + 20000;
          if (bVar27) {
            local_34[0] = iVar4;
          }
        }
        if (local_34[0] == 0x14b) {
          dVar30 = RLU(psVar6,false);
          if (dVar30 <= PARJ[0x19]) goto LAB_00128919;
          goto LAB_00127f0b;
        }
        if ((local_34[0] != 0xdd) || (dVar30 = RLU(psVar6,false), dVar30 <= PARJ[0x18]))
        goto LAB_00128919;
      } while( true );
    }
    if (KFL2 * KFL1 < 1 || (10 < uVar19 || 10 < uVar5)) {
      if (uVar19 < 0xb || uVar5 < 0xb) {
        if (-1 < KFL2 * KFL1 || uVar5 < 0xb && uVar19 < 0xb) goto LAB_00127581;
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)__return_storage_ptr__,(iterator)0x0,
                   (int *)&local_38);
      }
      else {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)__return_storage_ptr__,(iterator)0x0,
                   (int *)&local_38);
      }
    }
    else {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)__return_storage_ptr__,(iterator)0x0,
                 (int *)&local_38);
    }
  }
  iVar18._M_current =
       (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar18._M_current ==
      (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)__return_storage_ptr__,iVar18,local_34);
    return __return_storage_ptr__;
  }
  pvVar17 = (vector<int,std::allocator<int>> *)
            &(__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  goto LAB_00128955;
  while (psVar25 = psVar6, dVar30 = RLU(psVar6,false), local_48 < dVar30) {
LAB_00128586:
    if (local_88._0_1_ == '\0') {
      iVar4 = (int)local_d8;
      iVar10 = SUB84(local_e0,0);
      psVar6 = (sophia_interface *)(ulong)local_4c;
      uVar5 = local_60;
      if (10 < local_4c) {
        if (local_50 == 0) {
          dVar30 = RLU(psVar6,false);
          local_38 = ~(int)(dVar30 * local_f0);
          if (-1 < (int)local_3c) {
            local_38 = (int)(dVar30 * local_f0) + 1;
          }
        }
        uVar5 = -local_38;
        if (0 < (int)local_38) {
          uVar5 = local_38;
        }
        psVar6 = (sophia_interface *)(ulong)(uVar5 + (int)local_68);
        iVar4 = (int)local_100;
        iVar10 = (int)local_b0;
        uVar5 = local_5c;
      }
    }
    else {
      do {
        while( true ) {
          dVar30 = RLU(psVar25,false);
          dVar30 = dVar30 * local_58;
          dVar31 = RLU(psVar25,false);
          dVar31 = dVar31 * local_58;
          dVar2 = RLU(psVar25,false);
          if ((int)dVar31 <= (int)dVar30) break;
          if (dVar2 * local_a8 <= 1.0) {
            uVar5 = 1;
            goto LAB_00128611;
          }
        }
      } while (local_a8 < dVar2);
      uVar5 = 3;
LAB_00128611:
      iVar10 = (int)dVar30 + 1;
      iVar4 = (int)dVar31 + 1;
      iVar13 = iVar4;
      if (iVar4 < iVar10) {
        iVar13 = iVar10;
      }
      iVar11 = iVar10;
      if (iVar4 < iVar10) {
        iVar11 = iVar4;
      }
      uVar19 = iVar11 * 100 + iVar13 * 1000 | uVar5;
      local_38 = -uVar19;
      if (-1 < (int)local_3c) {
        local_38 = uVar19;
      }
      psVar6 = (sophia_interface *)(ulong)local_4c;
    }
    uVar19 = (iVar10 != iVar4) + 3 + (uint)(iVar10 != iVar4);
    if (uVar5 != 3) {
      uVar19 = uVar5;
    }
    iVar13 = (int)psVar6;
    uVar7 = (ulong)((iVar13 != iVar4 && iVar13 != iVar10) + uVar19);
    dVar30 = PARJ[0x11] * PARF[uVar7 + 0x45] + PARF[uVar7 + 0x3b];
    local_48 = dVar30;
    if ((local_70._0_4_ == 1) && (1 < MSTJ[0xb])) {
      iVar11 = iVar4;
      if (iVar4 < iVar10) {
        iVar11 = iVar10;
      }
      uVar28 = SUB84(local_d0,0);
      uVar29 = (undefined4)((ulong)local_d0 >> 0x20);
      if (iVar11 != 3) {
        uVar28 = SUB84(local_b8,0);
        uVar29 = (undefined4)((ulong)local_b8 >> 0x20);
      }
      iVar11 = iVar10;
      if (iVar4 < iVar10) {
        iVar11 = iVar4;
      }
      dVar31 = local_c8;
      if (iVar11 != 3) {
        dVar31 = (double)CONCAT44(uVar29,uVar28);
      }
      if (uVar5 == 1) {
        local_48 = ((dVar31 / local_c0 + 1.0) * dVar30) / local_a0;
        dVar31 = dVar31 / local_c0;
      }
      if (uVar5 == 3) {
        local_48 = ((dVar31 + 1.0) * local_48) / local_90;
      }
    }
    local_80 = (double)CONCAT44(local_80._4_4_,uVar5);
    if (local_50 != 0) goto LAB_001287e9;
  }
  dVar30 = PARJ[0x11] * PARF[uVar7 + 0x45] + PARF[uVar7 + 0x3b];
LAB_001287e9:
  iVar11 = iVar10;
  if (iVar10 < iVar13) {
    iVar11 = iVar13;
  }
  if (iVar11 < iVar4) {
    iVar11 = iVar4;
  }
  iVar26 = iVar13;
  if (iVar10 < iVar13) {
    iVar26 = iVar10;
  }
  if (iVar4 < iVar26) {
    iVar26 = iVar4;
  }
  iVar4 = ((iVar10 + iVar4 + iVar13) - iVar11) - iVar26;
  local_48 = dVar30;
  dVar30 = RLU(psVar6,false);
  dVar30 = dVar30 * local_48;
  bVar27 = dVar30 != PARF[uVar7 + 0x3b];
  bVar1 = PARF[uVar7 + 0x3b] <= dVar30;
  bVar3 = bVar1 && bVar27;
  if (((bVar1 && bVar27) || (iVar11 <= iVar4)) || (iVar4 <= iVar26)) {
LAB_001288f5:
    iVar4 = iVar11 * 1000 + iVar26 * 10 + iVar4 * 100;
LAB_00128908:
    iVar4 = iVar4 + bVar3 + 2 + (uint)bVar3;
    local_34[0] = -iVar4;
    if (-1 < (int)local_3c) {
      local_34[0] = iVar4;
    }
  }
  else {
    if ((local_80._0_4_ == 1) && (iVar13 != iVar11)) {
      local_48 = 0.25;
LAB_001288d8:
      dVar30 = RLU(psVar6,false);
      uVar5 = (uint)(dVar30 + local_48);
    }
    else {
      uVar5 = (uint)(local_80._0_4_ == 1 && iVar13 == iVar11);
      if ((local_80._0_4_ == 3) && (iVar13 != iVar11)) {
        local_48 = 0.75;
        goto LAB_001288d8;
      }
    }
    if (uVar5 == 1) {
      iVar4 = iVar26 * 100 + iVar11 * 1000 + iVar4 * 10;
      goto LAB_00128908;
    }
    if (uVar5 == 0) goto LAB_001288f5;
  }
LAB_00128919:
  __return_storage_ptr__ = (vector<int,_std::allocator<int>_> *)local_78;
  pvVar17 = local_78 + 8;
  iVar18._M_current = *(int **)(local_78 + 8);
  piVar9 = *(int **)(local_78 + 0x10);
  if (iVar18._M_current == piVar9) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              (local_78,iVar18,(int *)&local_38);
    iVar18._M_current = *(int **)((long)__return_storage_ptr__ + 8);
    piVar9 = *(int **)((long)__return_storage_ptr__ + 0x10);
  }
  else {
    *iVar18._M_current = local_38;
    iVar18._M_current = iVar18._M_current + 1;
    *(int **)pvVar17 = iVar18._M_current;
  }
  if (iVar18._M_current == piVar9) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)__return_storage_ptr__,iVar18,local_34);
    return (vector<int,_std::allocator<int>_> *)
           (vector<int,std::allocator<int>> *)__return_storage_ptr__;
  }
LAB_00128955:
  *iVar18._M_current = local_34[0];
  *(int **)pvVar17 = iVar18._M_current + 1;
  return (vector<int,_std::allocator<int>_> *)
         (vector<int,std::allocator<int>> *)__return_storage_ptr__;
}

Assistant:

std::vector<int> sophia_interface::LUKFDI(int KFL1, int KFL2) {
// Purpose: to generate a new flavour pair and combine off a hadron.
// Default flavour values. Input consistency checks.
// Returns vector (KFL3, KF).
    int KFL3 = 0;
    int KF = 0;
    std::vector<int> output;
    int KF1A = std::abs(KFL1);
    int KF2A = std::abs(KFL2);
    if (KF1A == 0) {output.push_back(KFL3); output.push_back(KF); return output;}
    if (KF2A != 0) {
        if (KF1A <= 10 && KF2A <= 10 && KFL1 * KFL2 > 0) {output.push_back(KFL3); output.push_back(KF); return output;}
        if (KF1A > 10 && KF2A > 10) {output.push_back(KFL3); output.push_back(KF); return output;}
        if ((KF1A > 10 || KF2A > 10) && KFL1 * KFL2 < 0) {output.push_back(KFL3); output.push_back(KF); return output;}
    }

    // Check if tabulated flavour probabilities are to be used. 
    bool skip = false;
    int KTAB1 = 0;
    int KTAB2 = 0;
    int KFL1A = 0;
    int KFL1B = 0;
    if (MSTJ[14] == 1) {
        KTAB1 = -1;
        if ((KF1A >= 1) && (KF1A <= 6)) KTAB1 = KF1A;
        KFL1A = (KF1A / 1000) % 10;
        KFL1B = (KF1A / 100) % 10;
        int KFL1S = KF1A % 10;
        if (KFL1A >= 1 && KFL1A <= 4 && KFL1B >= 1 && KFL1B <= 4) KTAB1 = 6 + KFL1A * (KFL1A - 2) + 2 * KFL1B + (KFL1S - 1) / 2;
        if (KFL1A >= 1 && KFL1A <= 4 && KFL1A == KFL1B) KTAB1--;
        if (KF1A >= 1 && KF1A <= 6) KFL1A = KF1A;
        KTAB2 = 0;
        if (KF2A != 0) {
            KTAB2 = -1;
            if (KF2A >= 1 && KF2A <= 6) KTAB2 = KF2A;
            int KFL2A = (KF2A / 1000) % 10;
            int KFL2B = (KF2A / 100) % 10;
            int KFL2S = KF2A % 10;
            if (KFL2A >= 1 && KFL2A <= 4 && KFL2B >= 1 && KFL2B <= 4) KTAB2 = 6 + KFL2A * (KFL2A - 2) + 2 * KFL2B + (KFL2S - 1) / 2;
            if (KFL2A >= 1 && KFL2A <= 4 && KFL2A == KFL2B) KTAB2--;
        }
        if (KTAB1 >= 0 && KTAB2 >= 0) skip = true;
    }

    // Parameters and breaking diquark parameter combinations.
    int KFL3A = 0;
    int KFLA = 0;
    int KFLB = 0;
    int KFLC = 0; 
    int KFS = 0;       
    bool repeat100 = false;
    do {
        repeat100 = false;
        if (skip == false) {
            double PAR2 = PARJ[1];
            double PAR3 = PARJ[2];
            double PAR4 = 3. * PARJ[3];
            double PAR3M = 0.;
            double PAR4M = 0.;
            double PARDM = 0.;
            double PARS0 = 0.;
            double PARS1 = 0.;
            double PARS2 = 0.;
            double PARSM = 0.;
            if (MSTJ[11] >= 2) {
                PAR3M = std::sqrt(PARJ[2]);
                PAR4M = 1. / (3. * std::sqrt(PARJ[3]));
                PARDM = PARJ[6] / (PARJ[6] + PAR3M * PARJ[5]);
                PARS0 = PARJ[4] * (2. + (1. + PAR2 * PAR3M * PARJ[6]) * (1. + PAR4M));
                PARS1 = PARJ[6] * PARS0 / (2. * PAR3M) + PARJ[4] * (PARJ[5] * (1. + PAR4M) + PAR2 * PAR3M * PARJ[5] * PARJ[6]);
                PARS2 = PARJ[4] * 2. * PARJ[5] * PARJ[6] * (PAR2 * PARJ[6] + (1. + PAR4M) / PAR3M);
                PARSM = std::max({PARS0, PARS1, PARS2});
                PAR4 = PAR4 * (1. + PARSM) / (1. + PARSM / (3. * PAR4M));
            }
     
            // Choice of whether to generate meson or baryon. 
            bool repeat110 = false;
            do {
                repeat110 = false;
                int MBARY = 0;
                int KFDA = 0;
                if (KF1A <= 10) {
                    if (KF2A == 0 && MSTJ[11] >= 1 && ((1. + PARJ[0]) * RLU()) > 1.) MBARY = 1;
                    if (KF2A > 10) MBARY = 2;
                    if (KF2A > 10 && KF2A <= 10000) KFDA = KF2A;
                } else {
                    MBARY = 2;
                    if (KF1A <= 10000) KFDA = KF1A;
                }

                // Possibility of process diquark -> meson + new diquark. 
                int KFLDS = 0;     
                if (KFDA != 0 && MSTJ[11] >= 2) {
                    int KFLDA = (KFDA / 1000) % 10;
                    int KFLDB = (KFDA / 100) % 10;
                    KFLDS = KFDA % 10;
                    double WTDQ = PARS0;
                    if (std::max(KFLDA, KFLDB) == 3) WTDQ = PARS1;
                    if (std::min(KFLDA, KFLDB) == 3) WTDQ = PARS2;
                    if (KFLDS == 1) WTDQ /= (3. * PAR4M);
                    if ((1. + WTDQ) * RLU() > 1.) MBARY = -1;
                    if (MBARY == -1 && KF2A != 0) {output.push_back(KFL3); output.push_back(KF); return output;}
                }
         
                // Flavour for meson, possibly with new flavour. 
                int KFLS = 0;
                if (MBARY <= 0) {
                    KFS = (KFL1 < 0)? -1 : 1;
                    if (MBARY == 0) {
                        int sgn = (-KFL1 < 0)? -1 : 1;
                        if (KF2A == 0) KFL3 = (1 + static_cast<int>((2. + PAR2) * RLU())) * sgn;
                        KFLA = std::max(KF1A, KF2A + std::abs(KFL3));
                        KFLB = std::min(KF1A, KF2A + std::abs(KFL3));
                        if (KFLA != KF1A) KFS = -KFS;
         
                    // Splitting of diquark into meson plus new diquark. 
                    } else {
                        int KFL1A = (KF1A / 1000) % 10;
                        int KFL1B = (KF1A / 100) % 10;
                        int KFL1D = 0;
                        int KFL1E = 0;
                        do {
                            KFL1D =  KFL1A + static_cast<int>(RLU() + 0.5) * (KFL1B - KFL1A);
                            KFL1E =  KFL1A + KFL1B - KFL1D;
                            if ((KFL1D == 3 && RLU() > PARDM) || (KFL1E == 3 && RLU() < PARDM)) {
                                KFL1D = KFL1A + KFL1B - KFL1D;
                                KFL1E = KFL1A + KFL1B - KFL1E;
                            }
                            KFL3A = 1 + static_cast<int>((2. + PAR2 * PAR3M * PARJ[6]) * RLU());
                        } while ((KFL1E != KFL3A && (RLU() > (1. + PAR4M) / std::max(2., 1. + PAR4M))) || (KFL1E == KFL3A && (RLU() > 2. / std::max(2., 1. + PAR4M))));
                        KFLDS = 3;
                        if (KFL1E != KFL3A) KFLDS = 2 * static_cast<int>(RLU() + 1. / (1. + PAR4M)) + 1;
                        int sgn = (-KFL1 < 0)? -1 : 1;
                        KFL3 = (10000 + 1000 * std::max(KFL1E, KFL3A) + 100 * std::min(KFL1E, KFL3A) + KFLDS) * sgn;
                        KFLA = std::max(KFL1D, KFL3A);
                        KFLB = std::min(KFL1D, KFL3A);
                        if (KFLA != KFL1D) KFS = -KFS;
                    }
         
                    // Form meson, with spin and flavour mixing for diagonal states. 
                    int KMUL = 0;
                    if (KFLA <= 2) KMUL = static_cast<int>(PARJ[10] + RLU());
                    if (KFLA == 3) KMUL = static_cast<int>(PARJ[11] + RLU());
                    if (KFLA >= 4) KMUL = static_cast<int>(PARJ[12] + RLU());
                    if (KMUL == 0 && PARJ[13] > 0.) {
                        if (RLU() < PARJ[13]) KMUL = 2;
                    } else if (KMUL == 1 && PARJ[14] + PARJ[15] + PARJ[16] > 0.) {
                        double RMUL = RLU();
                        if (RMUL < PARJ[14]) KMUL = 3;
                        if (KMUL == 1 && RMUL < PARJ[14] + PARJ[15]) KMUL = 4;
                        if (KMUL == 1 && RMUL < PARJ[14] + PARJ[15] + PARJ[16]) KMUL = 5;
                    }
                    KFLS = 3;
                    if (KMUL == 0 || KMUL == 3) KFLS = 1;
                    if (KMUL == 5) KFLS = 5;
                    if (KFLA != KFLB) {
                        KF = (100 * KFLA + 10 * KFLB + KFLS) * KFS * std::pow(-1, KFLA);
                    } else {
                        double RMIX = RLU();
                        int IMIX = 2 * KFLA + 10 * KMUL;
                        if (KFLA <= 3) KF = 110 * (1 + static_cast<int>(RMIX + PARF[IMIX - 2]) + static_cast<int>(RMIX + PARF[IMIX - 1])) + KFLS;
                        if (KFLA >= 4) KF = 110 * KFLA + KFLS;
                    }
                    if (KMUL == 2 || KMUL == 3) {
                        int sgn = (KF < 0)? -1 : 1;
                        KF += 10000 * sgn;
                    }
                    if (KMUL == 4) {
                        int sgn = (KF < 0)? -1 : 1;
                        KF += 20000 * sgn;
                    }

                    // Optional extra suppression of eta and eta'.
                    if (KF == 221) {
                        if (RLU() > PARJ[24]) {repeat110 = true; continue;}
                    } else if (KF == 331) {
                        if (RLU() > PARJ[25]) {repeat110 = true; continue;}
                    }

                // Generate diquark flavour.
                } else {
                    double WT = 0.;
                    int KBARY = 0.;
                    do {
                        if (KF1A <= 10 && KF2A == 0) {
                            KFLA = KF1A;
                            do {
                                KFLB = 1 + static_cast<int>((2. + PAR2 * PAR3) * RLU());
                                KFLC = 1 + static_cast<int>((2. + PAR2 * PAR3) * RLU());
                                KFLDS = 1;
                                if (KFLB >= KFLC) KFLDS = 3;
                            } while ((KFLDS == 1 && PAR4 * RLU() > 1.) || (KFLDS == 3 && PAR4 < RLU()));
                            int sgn = (KFL1 < 0)? -1 : 1;
                            KFL3 = (1000 * std::max(KFLB, KFLC) + 100 * std::min(KFLB, KFLC) + KFLDS) * sgn;

                        // Take diquark flavour from input. 
                        } else if (KF1A <= 10) {
                            KFLA = KF1A;
                            KFLB = (KF2A / 1000) % 10;
                            KFLC = (KF2A / 100) % 10;
                            KFLDS = KF2A % 10;

                        // Generate (or take from input) quark to go with diquark. 
                        } else {
                            if (KF2A == 0) {
                                int sgn = (KFL1 < 0)? -1 : 1;
                                KFL3 = (1 + static_cast<int>((2. + PAR2) * RLU())) * sgn;
                            }
                            KFLA = KF2A + std::abs(KFL3);
                            KFLB = (KF1A / 1000) % 10;
                            KFLC = (KF1A / 100) % 10;
                            KFLDS = KF1A % 10;
                        }

                        // SU(6) factors for formation of baryon. Try again if fails. 
                        KBARY = KFLDS;
                        if (KFLDS == 3 && KFLB != KFLC) KBARY = 5;
                        if (KFLA != KFLB && KFLA != KFLC) KBARY++;
                        WT = PARF[59 + KBARY] + PARJ[17] * PARF[69 + KBARY];
                        if (MBARY == 1 && MSTJ[11] >= 2) {
                            double WTDQ = PARS0;
                            if (std::max(KFLB, KFLC) == 3) WTDQ = PARS1;
                            if (std::min(KFLB, KFLC) == 3) WTDQ = PARS2;
                            if (KFLDS == 1) WTDQ /= (3. * PAR4M);
                            if (KFLDS == 1) WT = WT * (1. + WTDQ) / (1. + PARSM / (3. * PAR4M));
                            if (KFLDS == 3) WT = WT * (1. + WTDQ) / (1. + PARSM);
                        }
                    } while (KF2A == 0 && WT < RLU());

                    // Form baryon. Distinguish Lambda- and Sigmalike baryons. 
                    int KFLD = std::max({KFLA, KFLB, KFLC});
                    int KFLF = std::min({KFLA, KFLB, KFLC});
                    int KFLE = KFLA + KFLB + KFLC - KFLD - KFLF;
                    KFLS = 2;
                    if ((PARF[59 + KBARY] + PARJ[17] * PARF[69 + KBARY]) * RLU() > PARF[59 + KBARY]) KFLS = 4;
                    int KFLL = 0;
                    if (KFLS == 2 && KFLD > KFLE && KFLE > KFLF) {
                        if (KFLDS == 1 && KFLA == KFLD) KFLL = 1;
                        if (KFLDS == 1 && KFLA != KFLD) KFLL = static_cast<int>(0.25 + RLU());
                        if (KFLDS == 3 && KFLA != KFLD) KFLL = static_cast<int>(0.75 + RLU());
                    }
                    if (KFLL == 0) {
                        int sgn = (KFL1 < 0)? -1 : 1;
                        KF = (1000 * KFLD + 100 * KFLE + 10 * KFLF + KFLS) * sgn;
                    }
                    if (KFLL == 1) {
                        int sgn = (KFL1 < 0)? -1 : 1;
                        KF = (1000 * KFLD + 100 * KFLF + 10 * KFLE + KFLS) * sgn;
                    }
                }

                output.push_back(KFL3);
                output.push_back(KF);
                return output;
            } while (repeat110);
        }  // end skip condition
        skip = false;

        // Use tabulated probabilities to select new flavour and hadron.
        int KT3L = KTAB2;
        int KT3U = KTAB2;
        if (KTAB2 == 0 && MSTJ[11] <= 0) {
            KT3L = 1;
            KT3U = 6;
        } else if (KTAB2 == 0 && KTAB1 >= 7 && MSTJ[11] <= 1) {
            KT3L = 1;
            KT3U = 6;
        } else if (KTAB2 == 0) {
            KT3L = 1;
            KT3U = 22;
        }
        double RFL = 0.;
        for (int KTS = 0; KTS < 3; ++KTS) {
            for (int KT3 = KT3L; KT3 < KT3U + 1; ++KT3) {
                RFL += PARF[120 + 80 * KTAB1 + 25 * KTS + KT3 - 1];
            }
        }
        RFL *= RLU();
        int KTABS = 0;
        int KTAB3 = 0;
        for (int KTS = 0; KTS < 3; ++KTS) {
            KTABS = KTS;
            bool breakLoop = false;
            for (int KT3 = KT3L; KT3 < KT3U + 1; ++KT3) {
                KTAB3 = KT3;
                RFL -= PARF[120 + 80 * KTAB1 + 25 * KTS + KT3 - 1];
                if (RFL <= 0.) {breakLoop = true; break;}
            }
            if (breakLoop) break;
        }

        // Reconstruct flavour of produced quark/diquark.
        int KFL3B = 0;
        if (KTAB3 <= 6) {
            KFL3A = KTAB3;
            KFL3B = 0;
            int sgn = (KFL1 * (2 * KTAB1 - 13) < 0)? -1 : 1;
            KFL3 = KFL3A * sgn;
        } else {
            KFL3A = 1;
            if (KTAB3 >= 8) KFL3A = 2;
            if (KTAB3 >= 11) KFL3A = 3;
            if (KTAB3 >= 16) KFL3A = 4;
            KFL3B = (KTAB3 - 6 - KFL3A * (KFL3A - 2)) / 2;
            KFL3 = 1000 * KFL3A + 100 * KFL3B + 1;
            if (KFL3A == KFL3B || KTAB3 != 6 + KFL3A * (KFL3A - 2) + 2 * KFL3B) KFL3 += 2;
            int sgn = (KFL1 * (13 - 2 * KTAB1) < 0)? -1 : 1;
            KFL3 = KFL3 * sgn;
        }

        // Reconstruct meson code. 
        if (KFL3A == KFL1A && KFL3B == KFL1B && (KFL3A <= 3 || KFL3B != 0)) {
            RFL = RLU() * (PARF[143 + 80 * KTAB1 + 25 * KTABS - 1] + PARF[144 + 80 * KTAB1 + 25 * KTABS -1] + PARF[145 + 80 * KTAB1 + 25 * KTABS - 1]);
            KF = 110 + 2 * KTABS + 1;
            if (RFL > PARF[143 + 80 * KTAB1 + 25 * KTABS - 1]) KF = 220 + 2 * KTABS + 1;
            if (RFL > PARF[143 + 80 * KTAB1 + 25 * KTABS - 1] + PARF[144 + 80 * KTAB1 + 25 * KTABS - 1]) KF = 330 + 2 * KTABS + 1;
        } else if (KTAB1 <= 6 && KTAB3 <= 6) {
            KFLA = std::max(KTAB1, KTAB3);
            KFLB = std::min(KTAB1, KTAB3);
            KFS = (KFL1 < 0)? -1 : 1;
            if (KFLA != KF1A) KFS = -KFS;
            KF = (100 * KFLA + 10 * KFLB + 2 * KTABS + 1) * KFS * std::pow(-1, KFLA);
        } else if (KTAB1 >= 7 && KTAB3 >= 7) {
            KFS = (KFL1 < 0)? -1 : 1;
            if (KFL1A == KFL3A) {
                KFLA = std::max(KFL1B, KFL3B);
                KFLB = std::min(KFL1B, KFL3B);
                if (KFLA != KFL1B) KFS = -KFS;
            } else if (KFL1A == KFL3B) {
                KFLA = KFL3A;
                KFLB = KFL1B;
                KFS = -KFS;
            } else if (KFL1B == KFL3A) {
                KFLA = KFL1A;
                KFLB = KFL3B;
            } else if (KFL1B == KFL3B) {
                KFLA = std::max(KFL1A, KFL3A);
                KFLB = std::min(KFL1A, KFL3A);
                if (KFLA != KFL1A) KFS = -KFS;
            } else {
                LUERRM(2, "LUKFDI: no matching flavours for qq -> qq");
                repeat100 = true;
                continue;
            } 
            KF = (100 * KFLA + 10 * KFLB + 2 * KTABS + 1) * KFS * std::pow(-1, KFLA);

        // Reconstruct baryon code.
        } else {
            if (KTAB1 >= 7) {
                KFLA = KFL3A;
                KFLB = KFL1A;
                KFLC = KFL1B;
            } else {
                KFLA = KFL1A;
                KFLB = KFL3A;
                KFLC = KFL3B;
            }
            int KFLD = std::max({KFLA, KFLB, KFLC});
            int KFLF = std::min({KFLA, KFLB, KFLC});
            int KFLE = KFLA + KFLB + KFLC - KFLD - KFLF;
            if (KTABS == 0) {
                int sgn = (KFL1 < 0)? -1 : 1;
                KF = (1000 * KFLD + 100 * KFLF + 10 * KFLE + 2) * sgn;
            }
            if (KTABS >= 1) {
                int sgn = (KFL1 < 0)? -1 : 1;
                KF = (1000 * KFLD + 100 * KFLE + 10 * KFLF + 2 * KTABS) * sgn;
            }
        }

        // Check that constructed flavour code is an allowed one.
        if (KFL2 != 0) KFL3 = 0;
        int KC = LUCOMP(KF);
        if (KC == 0) {
            LUERRM(2, "LUKFDI: user-defined flavour probabilities failed");
            repeat100 = true;
            continue;
        }
    } while (repeat100);
    
    output.push_back(KFL3);
    output.push_back(KF);
    return output;
}